

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTry
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Try *curr)

{
  bool bVar1;
  Expression **childp;
  Expression **expr;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  Try *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  note(this,&curr->body,
       (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id);
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                 (&(curr->catchBodies).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  _expr = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                    (&(curr->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
            operator!=((Iterator *)&__end2.index,(Iterator *)&expr);
    if (!bVar1) break;
    childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
             operator*((Iterator *)&__end2.index);
    note(this,childp,
         (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    note(&curr->body, curr->type);
    for (auto& expr : curr->catchBodies) {
      note(&expr, curr->type);
    }
  }